

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

int __thiscall glu::ShaderProgram::init(ShaderProgram *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  size_type sVar4;
  Shader *this_00;
  reference ppSVar5;
  ShaderProgram *pSVar6;
  pointer pAVar7;
  char *pcVar8;
  value_type pcVar9;
  reference ppcVar10;
  long lVar11;
  long in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  pointer *__rhs;
  bool local_c1;
  int shaderNdx_2;
  int shaderType_2;
  int ndx;
  vector<const_char_*,_std::allocator<const_char_*>_> tfVaryings;
  __normal_iterator<const_glu::AttribLocationBinding_*,_std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>_>
  local_68;
  const_iterator binding;
  int shaderNdx_1;
  int shaderType_1;
  int local_3c;
  char *pcStack_38;
  int length;
  char *source;
  ShaderType local_28;
  int shaderNdx;
  int shaderType;
  bool shadersOk;
  ProgramSources *sources_local;
  Functions *gl_local;
  ShaderProgram *this_local;
  
  shaderNdx._3_1_ = 1;
  local_28 = SHADERTYPE_VERTEX;
  pSVar6 = this;
  _shaderType = in_RDX;
  sources_local = (ProgramSources *)ctx;
  gl_local = (Functions *)this;
  while (iVar3 = (int)pSVar6, (int)local_28 < 6) {
    source._4_4_ = 0;
    while( true ) {
      iVar3 = source._4_4_;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(_shaderType + (long)(int)local_28 * 0x18));
      if ((int)sVar4 <= iVar3) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(_shaderType + (long)(int)local_28 * 0x18),(long)source._4_4_);
      pcStack_38 = (char *)std::__cxx11::string::c_str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(_shaderType + (long)(int)local_28 * 0x18),(long)source._4_4_);
      local_3c = std::__cxx11::string::size();
      lVar11 = (long)(int)local_28;
      sVar4 = std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::size
                        (this->m_shaders + lVar11);
      std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::reserve
                (this->m_shaders + lVar11,sVar4 + 1);
      lVar11 = (long)(int)local_28;
      this_00 = (Shader *)operator_new(0x68);
      Shader::Shader(this_00,(Functions *)sources_local,local_28);
      _shaderNdx_1 = this_00;
      std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::push_back
                (this->m_shaders + lVar11,(value_type *)&shaderNdx_1);
      ppSVar5 = std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::back
                          (this->m_shaders + (int)local_28);
      Shader::setSources(*ppSVar5,1,&stack0xffffffffffffffc8,&local_3c);
      ppSVar5 = std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::back
                          (this->m_shaders + (int)local_28);
      Shader::compile(*ppSVar5);
      local_c1 = false;
      if ((shaderNdx._3_1_ & 1) != 0) {
        ppSVar5 = std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::back
                            (this->m_shaders + (int)local_28);
        local_c1 = Shader::getCompileStatus(*ppSVar5);
      }
      shaderNdx._3_1_ = local_c1;
      source._4_4_ = source._4_4_ + 1;
    }
    local_28 = local_28 + SHADERTYPE_FRAGMENT;
    pSVar6 = (ShaderProgram *)(ulong)local_28;
  }
  if ((shaderNdx._3_1_ & 1) != 0) {
    for (binding._M_current._4_4_ = 0; binding._M_current._4_4_ < 6;
        binding._M_current._4_4_ = binding._M_current._4_4_ + 1) {
      binding._M_current._0_4_ = 0;
      while( true ) {
        iVar3 = (int)binding._M_current;
        sVar4 = std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::size
                          (this->m_shaders + binding._M_current._4_4_);
        if ((int)sVar4 <= iVar3) break;
        ppSVar5 = std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::operator[]
                            (this->m_shaders + binding._M_current._4_4_,
                             (long)(int)binding._M_current);
        dVar2 = Shader::getShader(*ppSVar5);
        Program::attachShader(&this->m_program,dVar2);
        binding._M_current._0_4_ = (int)binding._M_current + 1;
      }
    }
    local_68._M_current =
         (AttribLocationBinding *)
         std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::begin
                   ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                     *)(_shaderType + 0x90));
    while( true ) {
      tfVaryings.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                    ::end((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                           *)(_shaderType + 0x90));
      __rhs = &tfVaryings.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      bVar1 = __gnu_cxx::operator!=
                        (&local_68,
                         (__normal_iterator<const_glu::AttribLocationBinding_*,_std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>_>
                          *)__rhs);
      if (!bVar1) break;
      pAVar7 = __gnu_cxx::
               __normal_iterator<const_glu::AttribLocationBinding_*,_std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>_>
               ::operator->(&local_68);
      dVar2 = pAVar7->location;
      __gnu_cxx::
      __normal_iterator<const_glu::AttribLocationBinding_*,_std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>_>
      ::operator->(&local_68);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      Program::bindAttribLocation(&this->m_program,dVar2,pcVar8);
      __gnu_cxx::
      __normal_iterator<const_glu::AttribLocationBinding_*,_std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>_>
      ::operator++(&local_68);
    }
    pcVar8 = extraout_RDX;
    if (*(int *)(_shaderType + 0xa8) != 0) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(_shaderType + 0xb0));
      std::allocator<const_char_*>::allocator((allocator<const_char_*> *)((long)&shaderType_2 + 3));
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&ndx,sVar4,
                 (allocator<const_char_*> *)((long)&shaderType_2 + 3));
      std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)((long)&shaderType_2 + 3))
      ;
      shaderNdx_2 = 0;
      while( true ) {
        sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)&ndx);
        if ((int)sVar4 <= shaderNdx_2) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(_shaderType + 0xb0),(long)shaderNdx_2);
        pcVar9 = (value_type)std::__cxx11::string::c_str();
        ppcVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                             ((vector<const_char_*,_std::allocator<const_char_*>_> *)&ndx,
                              (long)shaderNdx_2);
        *ppcVar10 = pcVar9;
        shaderNdx_2 = shaderNdx_2 + 1;
      }
      sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)&ndx);
      ppcVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)&ndx,0);
      __rhs = (pointer *)(sVar4 & 0xffffffff);
      Program::transformFeedbackVaryings
                (&this->m_program,(int)sVar4,ppcVar10,*(deUint32 *)(_shaderType + 0xa8));
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&ndx);
      pcVar8 = extraout_RDX_00;
    }
    if ((*(byte *)(_shaderType + 200) & 1) != 0) {
      __rhs = (pointer *)&DAT_00000001;
      Program::setSeparable(&this->m_program,true);
      pcVar8 = extraout_RDX_01;
    }
    iVar3 = Program::link(&this->m_program,(char *)__rhs,pcVar8);
  }
  return iVar3;
}

Assistant:

void ShaderProgram::init (const glw::Functions& gl, const ProgramSources& sources)
{
	try
	{
		bool shadersOk = true;

		for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
		{
			for (int shaderNdx = 0; shaderNdx < (int)sources.sources[shaderType].size(); ++shaderNdx)
			{
				const char* source	= sources.sources[shaderType][shaderNdx].c_str();
				const int	length	= (int)sources.sources[shaderType][shaderNdx].size();

				m_shaders[shaderType].reserve(m_shaders[shaderType].size() + 1);

				m_shaders[shaderType].push_back(new Shader(gl, ShaderType(shaderType)));
				m_shaders[shaderType].back()->setSources(1, &source, &length);
				m_shaders[shaderType].back()->compile();

				shadersOk = shadersOk && m_shaders[shaderType].back()->getCompileStatus();
			}
		}

		if (shadersOk)
		{
			for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
				for (int shaderNdx = 0; shaderNdx < (int)m_shaders[shaderType].size(); ++shaderNdx)
					m_program.attachShader(m_shaders[shaderType][shaderNdx]->getShader());

			for (std::vector<AttribLocationBinding>::const_iterator binding = sources.attribLocationBindings.begin(); binding != sources.attribLocationBindings.end(); ++binding)
				m_program.bindAttribLocation(binding->location, binding->name.c_str());

			DE_ASSERT((sources.transformFeedbackBufferMode == GL_NONE) == sources.transformFeedbackVaryings.empty());
			if (sources.transformFeedbackBufferMode != GL_NONE)
			{
				std::vector<const char*> tfVaryings(sources.transformFeedbackVaryings.size());
				for (int ndx = 0; ndx < (int)tfVaryings.size(); ndx++)
					tfVaryings[ndx] = sources.transformFeedbackVaryings[ndx].c_str();

				m_program.transformFeedbackVaryings((int)tfVaryings.size(), &tfVaryings[0], sources.transformFeedbackBufferMode);
			}

			if (sources.separable)
				m_program.setSeparable(true);

			m_program.link();
		}
	}
	catch (...)
	{
		for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
			for (int shaderNdx = 0; shaderNdx < (int)m_shaders[shaderType].size(); ++shaderNdx)
				delete m_shaders[shaderType][shaderNdx];
		throw;
	}
}